

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigMiterProve(Ivy_FraigMan_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pIVar3;
  int iVar4;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pIVar5;
  sat_solver *psVar6;
  double *pdVar7;
  abctime aVar8;
  abctime aVar9;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  Ivy_Obj_t *pNew;
  Ivy_Man_t *pIVar13;
  ulong uVar14;
  uint local_48;
  lit local_44;
  ulong local_40;
  Ivy_Obj_t *local_38;
  
  Abc_Clock();
  uVar14 = 0;
  while( true ) {
    p_00 = p->pManAig->vPos;
    if (p_00->nSize <= (int)uVar14) {
      return;
    }
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p_00,(int)uVar14);
    pIVar5 = Ivy_ObjChild0Equiv(pObj);
    pIVar13 = p->pManFraig;
    pIVar3 = pIVar13->pConst1;
    if (pIVar5 == pIVar3) break;
    if (pIVar5 != (Ivy_Obj_t *)((ulong)pIVar3 ^ 1)) {
      pNew = (Ivy_Obj_t *)((ulong)pIVar5 & 0xfffffffffffffffe);
      if ((((uint)pIVar5 ^ *(uint *)&pNew->field_0x8 >> 7) & 1) != 0) break;
      if (pIVar3 == pNew) {
        __assert_fail("pNew != p->pManFraig->pConst1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0x8e2,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      p->nSatCalls = p->nSatCalls + 1;
      local_40 = uVar14;
      local_38 = pObj;
      if (p->pSat == (sat_solver *)0x0) {
        psVar6 = sat_solver_new();
        p->pSat = psVar6;
        sat_solver_setnvars(psVar6,1000);
        psVar6 = p->pSat;
        pdVar7 = (double *)calloc((long)psVar6->cap,8);
        psVar6->factors = pdVar7;
        p->nSatVars = 1;
      }
      Ivy_FraigNodeAddToSolver(p,(Ivy_Obj_t *)0x0,pNew);
      Ivy_FraigSetActivityFactors(p,(Ivy_Obj_t *)0x0,pNew);
      aVar8 = Abc_Clock();
      local_48 = (*(uint *)&pNew->field_0x8 >> 7 & 1) + *(int *)&pNew->pNextFan0 * 2;
      iVar4 = sat_solver_solve(p->pSat,(lit *)&local_48,&local_44,(long)p->pParams->nBTLimitMiter,0,
                               p->nBTLimitGlobal,p->nInsLimitGlobal);
      aVar9 = Abc_Clock();
      p->timeSat = p->timeSat + (aVar9 - aVar8);
      aVar9 = Abc_Clock();
      lVar10 = aVar9 - aVar8;
      if (iVar4 == -1) {
        p->timeSatUnsat = p->timeSatUnsat + lVar10;
        local_48 = local_48 ^ 1;
        iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_48,&local_44);
        if (iVar4 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                        ,0x903,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
        }
        uVar1 = p->nSatCallsUnsat;
        uVar2 = p->nSatProof;
        p->nSatCallsUnsat = uVar1 + 1;
        p->nSatProof = uVar2 + 1;
        *(ulong *)(((ulong)local_38->pFanin0 & 0xfffffffffffffffe) + 0x48) =
             (ulong)((uint)local_38->pFanin0 & 1) ^ (ulong)p->pManFraig->pConst1 ^ 1;
        uVar14 = local_40;
      }
      else {
        if (iVar4 == 1) {
          p->timeSatSat = p->timeSatSat + lVar10;
          if (p->pPatWords != (uint *)0x0) {
            Ivy_FraigSavePattern(p);
          }
          p->nSatCallsSat = p->nSatCallsSat + 1;
          pIVar13 = p->pManFraig;
          pvVar11 = malloc((long)pIVar13->nObjs[1] << 2);
          for (lVar10 = 0; lVar10 < pIVar13->vPis->nSize; lVar10 = lVar10 + 1) {
            pvVar12 = Vec_PtrEntry(pIVar13->vPis,(int)lVar10);
            *(uint *)((long)pvVar11 + lVar10 * 4) =
                 (uint)(p->pSat->model[*(int *)((long)pvVar12 + 0x28)] == 1);
            pIVar13 = p->pManFraig;
          }
LAB_00645aac:
          pIVar13->pData = pvVar11;
          return;
        }
        p->timeSatFail = p->timeSatFail + lVar10;
        pNew->field_0x9 = pNew->field_0x9 | 1;
        p->nSatFailsReal = p->nSatFailsReal + 1;
        uVar14 = local_40;
      }
    }
    uVar14 = (ulong)((int)uVar14 + 1);
  }
  pvVar11 = calloc(1,(long)pIVar13->nObjs[1] << 2);
  goto LAB_00645aac;
}

Assistant:

void Ivy_FraigMiterProve( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj, * pObjNew;
    int i, RetValue;
    abctime clk = Abc_Clock();
    int fVerbose = 0;
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        if ( i && fVerbose )
        {
            ABC_PRT( "Time", Abc_Clock() -clk );
        }
        pObjNew = Ivy_ObjChild0Equiv(pObj);
        // check if the output is constant 1
        if ( pObjNew == p->pManFraig->pConst1 )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is constant 1.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
        // check if the output is constant 0
        if ( pObjNew == Ivy_Not(p->pManFraig->pConst1) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is already constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            continue;
        }
        // check if the output can be constant 0
        if ( Ivy_Regular(pObjNew)->fPhase != (unsigned)Ivy_IsComplement(pObjNew) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) cannot be constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
/*
        // check the representative of this node
        pRepr = Ivy_ObjClassNodeRepr(Ivy_ObjFanin0(pObj));
        if ( Ivy_Regular(pRepr) != p->pManAig->pConst1 )
            printf( "Representative is not constant 1.\n" );
        else
            printf( "Representative is constant 1.\n" );
*/
        // try to prove the output constant 0
        RetValue = Ivy_FraigNodeIsConst( p, Ivy_Regular(pObjNew) );
        if ( RetValue == 1 )  // proved equivalent
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) was proved constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // set the constant miter
            Ivy_ObjFanin0(pObj)->pEquiv = Ivy_NotCond( p->pManFraig->pConst1, !Ivy_ObjFaninC0(pObj) );
            continue;
        }
        if ( RetValue == -1 ) // failed
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) has timed out at %d backtracks.  ", i, Ivy_ManPoNum(p->pManAig), p->pParams->nBTLimitMiter );
            continue;
        }
        // proved satisfiable
        if ( fVerbose )
            printf( "Output %2d (out of %2d) was proved NOT a constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
        // create the model
        p->pManFraig->pData = Ivy_FraigCreateModel(p);
        break;
    }
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() -clk );
    }
}